

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

int nghttp2_frame_pack_altsvc(nghttp2_bufs *bufs,nghttp2_extension *frame)

{
  uint8_t **ppuVar1;
  undefined8 *puVar2;
  nghttp2_buf_chain *pnVar3;
  int iVar4;
  uint8_t *buf;
  
  puVar2 = (undefined8 *)frame->payload;
  pnVar3 = bufs->head;
  if ((ulong)((long)(pnVar3->buf).end - (long)(pnVar3->buf).last) < puVar2[1] + puVar2[3] + 2) {
    __assert_fail("nghttp2_buf_avail(buf) >= 2 + altsvc->origin_len + altsvc->field_value_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x2e3,"int nghttp2_frame_pack_altsvc(nghttp2_bufs *, nghttp2_extension *)");
  }
  buf = (pnVar3->buf).pos + -9;
  (pnVar3->buf).pos = buf;
  nghttp2_frame_pack_frame_hd(buf,&frame->hd);
  nghttp2_put_uint16be((pnVar3->buf).last,*(uint16_t *)(puVar2 + 1));
  ppuVar1 = &(pnVar3->buf).last;
  *ppuVar1 = *ppuVar1 + 2;
  iVar4 = nghttp2_bufs_add(bufs,(void *)*puVar2,puVar2[1]);
  if (iVar4 == 0) {
    iVar4 = nghttp2_bufs_add(bufs,(void *)puVar2[2],puVar2[3]);
    if (iVar4 == 0) {
      return 0;
    }
    __assert_fail("rv == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x2f2,"int nghttp2_frame_pack_altsvc(nghttp2_bufs *, nghttp2_extension *)");
  }
  __assert_fail("rv == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x2ee,"int nghttp2_frame_pack_altsvc(nghttp2_bufs *, nghttp2_extension *)");
}

Assistant:

int nghttp2_frame_pack_altsvc(nghttp2_bufs *bufs, nghttp2_extension *frame) {
  int rv;
  nghttp2_buf *buf;
  nghttp2_ext_altsvc *altsvc;

  /* This is required with --disable-assert. */
  (void)rv;

  altsvc = frame->payload;

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >=
         2 + altsvc->origin_len + altsvc->field_value_len);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint16be(buf->last, (uint16_t)altsvc->origin_len);
  buf->last += 2;

  rv = nghttp2_bufs_add(bufs, altsvc->origin, altsvc->origin_len);

  assert(rv == 0);

  rv = nghttp2_bufs_add(bufs, altsvc->field_value, altsvc->field_value_len);

  assert(rv == 0);

  return 0;
}